

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeMapRef.h
# Opt level: O0

char * __thiscall
GenApi_3_4::CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>::_GetDeviceName
          (CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *this)

{
  ExceptionReporter<GenICam_3_4::AccessException> *this_00;
  long in_RSI;
  char *in_RDI;
  undefined3 in_stack_ffffffffffffff38;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffff3c;
  ExceptionReporter<GenICam_3_4::AccessException> *in_stack_ffffffffffffff40;
  char local_b8 [184];
  
  if (*(long *)(in_RSI + 8) != 0) {
    (**(code **)(**(long **)(in_RSI + 8) + 0x38))(in_RDI);
    return in_RDI;
  }
  uVar1 = CONCAT13(1,in_stack_ffffffffffffff38);
  this_00 = (ExceptionReporter<GenICam_3_4::AccessException> *)__cxa_allocate_exception(0x1f0);
  GenICam_3_4::ExceptionReporter<GenICam_3_4::AccessException>::ExceptionReporter
            (in_stack_ffffffffffffff40,(char *)CONCAT44(in_stack_ffffffffffffff3c,uVar1),
             (int)((ulong)in_RSI >> 0x20),in_RDI);
  GenICam_3_4::ExceptionReporter<GenICam_3_4::AccessException>::Report
            (this_00,local_b8,"Feature not present (reference not valid)");
  __cxa_throw(this_00,&GenICam_3_4::AccessException::typeinfo,
              GenICam_3_4::AccessException::~AccessException);
}

Assistant:

inline GENICAM_NAMESPACE::gcstring CNodeMapRefT<TCameraParams>::_GetDeviceName() const
    {
        if(_Ptr)
            return _Ptr->GetDeviceName();
        throw ACCESS_EXCEPTION("Feature not present (reference not valid)");
    }